

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_equals
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_type *ptVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  t_field *ptVar6;
  pointer pptVar7;
  t_netstd_generator *ptVar8;
  char *pcVar9;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_150);
  poVar5 = std::operator<<(poVar5,"public override bool Equals(object that)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_130);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_150);
  poVar5 = std::operator<<(poVar5,"if (!(that is ");
  type_name_abi_cxx11_(&local_130,this,&tstruct->super_t_type,false);
  poVar5 = std::operator<<(poVar5,(string *)&local_130);
  poVar5 = std::operator<<(poVar5," other)) return false;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_110);
  poVar5 = std::operator<<(poVar5,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  bVar3 = true;
  for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    if (bVar3) {
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_150);
      std::operator<<(poVar5,"return ");
      std::__cxx11::string::~string((string *)&local_150);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      bVar3 = false;
    }
    else {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_150);
      std::operator<<(poVar5,"&& ");
      std::__cxx11::string::~string((string *)&local_150);
    }
    ptVar6 = *pptVar7;
    if (ptVar6->req_ != T_REQUIRED) {
      poVar5 = std::operator<<(out,"((__isset.");
      std::__cxx11::string::string((string *)&local_b0,(string *)&(*pptVar7)->name_);
      ptVar8 = this;
      normalize_name(&local_130,this,&local_b0,false);
      get_isset_name(&local_150,ptVar8,&local_130);
      poVar5 = std::operator<<(poVar5,(string *)&local_150);
      poVar5 = std::operator<<(poVar5," == other.__isset.");
      std::__cxx11::string::string((string *)&local_50,(string *)&(*pptVar7)->name_);
      ptVar8 = this;
      normalize_name(&local_d0,this,&local_50,false);
      get_isset_name(&local_110,ptVar8,&local_d0);
      poVar5 = std::operator<<(poVar5,(string *)&local_110);
      poVar5 = std::operator<<(poVar5,") && ((!__isset.");
      std::__cxx11::string::string((string *)&local_f0,(string *)&(*pptVar7)->name_);
      ptVar8 = this;
      normalize_name(&local_90,this,&local_f0,false);
      get_isset_name(&local_70,ptVar8,&local_90);
      poVar5 = std::operator<<(poVar5,(string *)&local_70);
      std::operator<<(poVar5,") || (");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_b0);
      ptVar6 = *pptVar7;
    }
    ptVar2 = ptVar6->type_;
    iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
    pcVar9 = "TCollections.Equals(";
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ptVar2->super_t_doc)._vptr_t_doc[7])(ptVar2);
      pcVar9 = "System.Object.Equals(";
      if ((char)iVar4 != '\0') {
        pcVar9 = "TCollections.Equals(";
      }
    }
    std::operator<<(out,pcVar9);
    prop_name_abi_cxx11_(&local_150,this,*pptVar7,false);
    poVar5 = std::operator<<(out,(string *)&local_150);
    poVar5 = std::operator<<(poVar5,", other.");
    prop_name_abi_cxx11_(&local_130,this,*pptVar7,false);
    poVar5 = std::operator<<(poVar5,(string *)&local_130);
    std::operator<<(poVar5,")");
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    if ((*pptVar7)->req_ != T_REQUIRED) {
      std::operator<<(out,")))");
    }
  }
  if (bVar3) {
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_150);
    poVar5 = std::operator<<(poVar5,"return true;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
    iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
  }
  else {
    poVar5 = std::operator<<(out,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    iVar4 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4;
  }
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + -1;
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_150);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_equals(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override bool Equals(object that)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "if (!(that is " << type_name(tstruct,false) << " other)) return false;" << endl
        << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;


    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool first = true;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
            out << indent() << "return ";
            indent_up();
        }
        else
        {
            out << endl;
            out << indent() << "&& ";
        }
        if (!field_is_required((*f_iter)))
        {
            out << "((__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << " == other.__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") && ((!__isset."
                << get_isset_name(normalize_name((*f_iter)->get_name())) << ") || (";
        }
        t_type* ttype = (*f_iter)->get_type();
        if (ttype->is_container() || ttype->is_binary())
        {
            out << "TCollections.Equals(";
        }
        else
        {
            out << "System.Object.Equals(";
        }
        out << prop_name((*f_iter)) << ", other." << prop_name((*f_iter)) << ")";
        if (!field_is_required((*f_iter)))
        {
            out << ")))";
        }
    }
    if (first)
    {
        out << indent() << "return true;" << endl;
    }
    else
    {
        out << ";" << endl;
        indent_down();
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}